

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::TextureSpecificationTests::init
          (TextureSpecificationTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint subZ;
  uint subW;
  uint subH;
  uint subD;
  uint imageHeight;
  uint rowLength;
  char *pcVar5;
  Context *pCVar6;
  TestNode *pTVar7;
  TestNode *pTVar8;
  TexImageCubeArrayBufferCase *pTVar9;
  TexSubImageCubeArrayBufferCase *pTVar10;
  TestNode *pTVar11;
  undefined8 extraout_RAX;
  undefined8 uVar12;
  long lVar13;
  string fmtName;
  allocator<char> local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  int levels;
  int layers;
  int size;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_teximage3d","Basic glTexImage3D() usage");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (lVar13 = 8; lVar13 != 0x318; lVar13 = lVar13 + 0x10) {
    pcVar5 = *(char **)(&UNK_00a11848 + lVar13);
    dVar1 = *(deUint32 *)((long)&PTR_anon_var_dwarf_38847c_00a11850 + lVar13);
    pTVar8 = (TestNode *)operator_new(0xd8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,pcVar5,(allocator<char> *)&local_1b8);
    std::operator+(&fmtName,&local_208,"_cube_array");
    BasicTexImageCubeArrayCase::BasicTexImageCubeArrayCase
              ((BasicTexImageCubeArrayCase *)pTVar8,pCVar6,fmtName._M_dataplus._M_p,
               SSBOArrayLengthTests::init::arraysSized + 1,dVar1,0x40,6);
    tcu::TestNode::addChild(pTVar7,pTVar8);
    std::__cxx11::string::~string((string *)&fmtName);
    std::__cxx11::string::~string((string *)&local_208);
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "teximage3d_pbo","glTexImage3D() from PBO");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (lVar13 = 8; lVar13 != 0x318; lVar13 = lVar13 + 0x10) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fmtName,*(char **)(&UNK_00a11848 + lVar13),(allocator<char> *)&local_208);
    dVar1 = *(deUint32 *)((long)&PTR_anon_var_dwarf_38847c_00a11850 + lVar13);
    pTVar9 = (TexImageCubeArrayBufferCase *)operator_new(0xf8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::operator+(&local_208,&fmtName,"_cube_array");
    TexImageCubeArrayBufferCase::TexImageCubeArrayBufferCase
              (pTVar9,pCVar6,local_208._M_dataplus._M_p,SSBOArrayLengthTests::init::arraysSized + 1,
               dVar1,0x14,6,0,0,0,0,0,4,0);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&fmtName);
  }
  for (lVar13 = 0x2c; lVar13 != 0x17c; lVar13 = lVar13 + 0x30) {
    pTVar9 = (TexImageCubeArrayBufferCase *)operator_new(0xf8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               *(char **)((long)&init::depthStencilFormats[2].name + lVar13 + 4),
               (allocator<char> *)&local_1b8);
    std::operator+(&fmtName,&local_208,"_cube_array");
    uVar2 = *(uint *)((long)&init::depthStencilFormats[3].name + lVar13 + 4);
    local_1c0 = (ulong)uVar2;
    uVar3 = *(uint *)((long)&init::depthStencilFormats[3].internalFormat + lVar13);
    local_1c8 = (ulong)uVar3;
    local_1d0 = (ulong)*(uint *)(&init::depthStencilFormats[3].field_0xc + lVar13);
    uVar4 = *(uint *)((long)&init::depthStencilFormats[4].name + lVar13);
    local_1d8 = (ulong)uVar4;
    TexImageCubeArrayBufferCase::TexImageCubeArrayBufferCase
              (pTVar9,pCVar6,fmtName._M_dataplus._M_p,SSBOArrayLengthTests::init::arraysSized + 1,
               *(deUint32 *)(&init::depthStencilFormats[2].field_0xc + lVar13),
               *(int *)((long)&init::depthStencilFormats[3].name + lVar13),uVar2,uVar3,
               *(uint *)(&init::depthStencilFormats[3].field_0xc + lVar13),uVar4,
               *(int *)((long)&init::depthStencilFormats[4].name + lVar13 + 4),
               *(int *)((long)&init::depthStencilFormats[4].internalFormat + lVar13),
               *(int *)(&init::depthStencilFormats[4].field_0xc + lVar13),
               *(int *)((long)&init::parameterCases[0].name + lVar13));
    tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&fmtName);
    std::__cxx11::string::~string((string *)&local_208);
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "teximage3d_depth","glTexImage3D() with depth or depth/stencil format");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (lVar13 = 8; lVar13 != 0x58; lVar13 = lVar13 + 0x10) {
    pTVar8 = (TestNode *)operator_new(0xd8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,*(char **)(&UNK_00a11b58 + lVar13),(allocator<char> *)&local_1b8
              );
    std::operator+(&fmtName,&local_208,"_cube_array");
    TexImageCubeArrayDepthCase::TexImageCubeArrayDepthCase
              ((TexImageCubeArrayDepthCase *)pTVar8,pCVar6,fmtName._M_dataplus._M_p,
               SSBOArrayLengthTests::init::arraysSized + 1,
               *(deUint32 *)((long)&init::depthStencilFormats[0].name + lVar13),0x40,6);
    tcu::TestNode::addChild(pTVar7,pTVar8);
    std::__cxx11::string::~string((string *)&fmtName);
    std::__cxx11::string::~string((string *)&local_208);
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "teximage3d_depth_pbo","glTexImage3D() with depth or depth/stencil format with pbo");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (lVar13 = 8; lVar13 != 0x58; lVar13 = lVar13 + 0x10) {
    pTVar8 = (TestNode *)operator_new(0xd8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,*(char **)(&UNK_00a11b58 + lVar13),(allocator<char> *)&local_1b8
              );
    std::operator+(&fmtName,&local_208,"_cube_array");
    TexImageCubeArrayDepthBufferCase::TexImageCubeArrayDepthBufferCase
              ((TexImageCubeArrayDepthBufferCase *)pTVar8,pCVar6,fmtName._M_dataplus._M_p,
               SSBOArrayLengthTests::init::arraysSized + 1,
               *(deUint32 *)((long)&init::depthStencilFormats[0].name + lVar13),0x40,6);
    tcu::TestNode::addChild(pTVar7,pTVar8);
    std::__cxx11::string::~string((string *)&fmtName);
    std::__cxx11::string::~string((string *)&local_208);
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "texsubimage3d_pbo","glTexSubImage3D() pixel buffer object tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (lVar13 = 8; lVar13 != 0x318; lVar13 = lVar13 + 0x10) {
    pTVar10 = (TexSubImageCubeArrayBufferCase *)operator_new(0x110);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,*(char **)(&UNK_00a11848 + lVar13),(allocator<char> *)&local_1b8
              );
    std::operator+(&fmtName,&local_208,"_cube_array");
    TexSubImageCubeArrayBufferCase::TexSubImageCubeArrayBufferCase
              (pTVar10,pCVar6,fmtName._M_dataplus._M_p,SSBOArrayLengthTests::init::arraysSized + 1,
               *(deUint32 *)((long)&PTR_anon_var_dwarf_38847c_00a11850 + lVar13),0x1a,0xc,1,2,0,0x17
               ,0x13,8,0,0,0,0,0,4,0);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar10);
    std::__cxx11::string::~string((string *)&fmtName);
    std::__cxx11::string::~string((string *)&local_208);
  }
  lVar13 = 0x44;
  while( true ) {
    if (lVar13 == 500) break;
    pTVar10 = (TexSubImageCubeArrayBufferCase *)operator_new(0x110);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,*(char **)((long)&init::parameterCases[5].skipImages + lVar13),
               (allocator<char> *)&local_1b8);
    std::operator+(&fmtName,&local_208,"_cube_array");
    uVar2 = *(uint *)((long)&init::parameterCases[5].offset + lVar13);
    local_1c0 = (ulong)uVar2;
    uVar3 = *(uint *)((long)&init::parameterCases[6].name + lVar13);
    local_1c8 = (ulong)uVar3;
    uVar4 = *(uint *)((long)&init::parameterCases[6].name + lVar13 + 4);
    local_1d0 = (ulong)uVar4;
    subZ = *(uint *)((long)&init::parameterCases[6].format + lVar13);
    local_1d8 = (ulong)subZ;
    subW = *(uint *)((long)&init::parameterCases[6].size + lVar13);
    local_178 = (ulong)subW;
    subH = *(uint *)((long)&init::parameterCases[6].depth + lVar13);
    local_180 = (ulong)subH;
    subD = *(uint *)((long)&init::parameterCases[6].imageHeight + lVar13);
    local_188 = (ulong)subD;
    imageHeight = *(uint *)((long)&init::parameterCases[6].rowLength + lVar13);
    local_190 = (ulong)imageHeight;
    rowLength = *(uint *)((long)&init::parameterCases[6].skipImages + lVar13);
    local_198 = (ulong)rowLength;
    TexSubImageCubeArrayBufferCase::TexSubImageCubeArrayBufferCase
              (pTVar10,pCVar6,fmtName._M_dataplus._M_p,SSBOArrayLengthTests::init::arraysSized + 1,
               *(deUint32 *)((long)&init::parameterCases[5].skipPixels + lVar13),
               *(int *)((long)&init::parameterCases[5].alignment + lVar13),uVar2,uVar3,uVar4,subZ,
               subW,subH,subD,imageHeight,rowLength,
               *(int *)((long)&init::parameterCases[6].skipRows + lVar13),
               *(int *)((long)&init::parameterCases[6].skipPixels + lVar13),
               *(int *)((long)&init::parameterCases[6].alignment + lVar13),
               *(int *)((long)&init::parameterCases[6].offset + lVar13),
               *(int *)((long)&init::paramCases[0].name + lVar13));
    tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar10);
    std::__cxx11::string::~string((string *)&fmtName);
    std::__cxx11::string::~string((string *)&local_208);
    lVar13 = lVar13 + 0x48;
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "texsubimage3d_depth","glTexSubImage3D() with depth or depth/stencil format");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (lVar13 = 8; lVar13 != 0x58; lVar13 = lVar13 + 0x10) {
    pTVar8 = (TestNode *)operator_new(0xd8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,*(char **)(&UNK_00a11b58 + lVar13),(allocator<char> *)&local_1b8
              );
    std::operator+(&fmtName,&local_208,"_cube_array");
    TexSubImageCubeArrayDepthCase::TexSubImageCubeArrayDepthCase
              ((TexSubImageCubeArrayDepthCase *)pTVar8,pCVar6,fmtName._M_dataplus._M_p,
               SSBOArrayLengthTests::init::arraysSized + 1,
               *(deUint32 *)((long)&init::depthStencilFormats[0].name + lVar13),0x39,6);
    tcu::TestNode::addChild(pTVar7,pTVar8);
    std::__cxx11::string::~string((string *)&fmtName);
    std::__cxx11::string::~string((string *)&local_208);
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"texstorage3d"
             ,"Basic glTexStorage3D() usage");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"format",
             "glTexStorage3D() with all formats");
  tcu::TestNode::addChild(pTVar7,pTVar8);
  for (lVar13 = 8; lVar13 != 0x318; lVar13 = lVar13 + 0x10) {
    pcVar5 = *(char **)(&UNK_00a11848 + lVar13);
    dVar1 = *(deUint32 *)((long)&PTR_anon_var_dwarf_38847c_00a11850 + lVar13);
    pTVar11 = (TestNode *)operator_new(0xd8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,pcVar5,(allocator<char> *)&local_1b8);
    std::operator+(&fmtName,&local_208,"_cube_array");
    BasicTexStorageCubeArrayCase::BasicTexStorageCubeArrayCase
              ((BasicTexStorageCubeArrayCase *)pTVar11,pCVar6,fmtName._M_dataplus._M_p,
               SSBOArrayLengthTests::init::arraysSized + 1,dVar1,0x39,6,6);
    tcu::TestNode::addChild(pTVar8,pTVar11);
    std::__cxx11::string::~string((string *)&fmtName);
    std::__cxx11::string::~string((string *)&local_208);
  }
  for (lVar13 = 8; lVar13 != 0x58; lVar13 = lVar13 + 0x10) {
    pcVar5 = *(char **)(&UNK_00a11b58 + lVar13);
    dVar1 = *(deUint32 *)((long)&init::depthStencilFormats[0].name + lVar13);
    pTVar11 = (TestNode *)operator_new(0xd8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,pcVar5,(allocator<char> *)&local_1b8);
    std::operator+(&fmtName,&local_208,"_cube_array");
    BasicTexStorageCubeArrayCase::BasicTexStorageCubeArrayCase
              ((BasicTexStorageCubeArrayCase *)pTVar11,pCVar6,fmtName._M_dataplus._M_p,
               SSBOArrayLengthTests::init::arraysSized + 1,dVar1,0x39,6,6);
    tcu::TestNode::addChild(pTVar8,pTVar11);
    std::__cxx11::string::~string((string *)&fmtName);
    std::__cxx11::string::~string((string *)&local_208);
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"size",
             "glTexStorage3D() with various sizes");
  tcu::TestNode::addChild(pTVar7,pTVar8);
  uVar12 = extraout_RAX;
  for (lVar13 = 8; lVar13 != 0x5c; lVar13 = lVar13 + 0xc) {
    size = *(int *)("cube_array_" + lVar13 + 0xb);
    layers = *(int *)(&UNK_0082053c + lVar13);
    levels = *(int *)((long)&init::texCubeArraySizes[0].size + lVar13);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"cube_array_",&local_209)
    ;
    de::toString<int>(&local_70,&size);
    std::operator+(&local_d0,&local_50,&local_70);
    std::operator+(&local_170,&local_d0,"x");
    de::toString<int>(&local_f0,&size);
    std::operator+(&local_b0,&local_170,&local_f0);
    std::operator+(&local_150,&local_b0,"x");
    de::toString<int>(&local_110,&layers);
    std::operator+(&local_90,&local_150,&local_110);
    std::operator+(&local_1b8,&local_90,"_");
    de::toString<int>(&local_130,&levels);
    std::operator+(&local_208,&local_1b8,&local_130);
    std::operator+(&fmtName,&local_208,"_levels");
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    pTVar7 = (TestNode *)operator_new(0xd8);
    BasicTexStorageCubeArrayCase::BasicTexStorageCubeArrayCase
              ((BasicTexStorageCubeArrayCase *)pTVar7,(this->super_TestCaseGroup).m_context,
               fmtName._M_dataplus._M_p,SSBOArrayLengthTests::init::arraysSized + 1,0x8058,size,
               layers,levels);
    tcu::TestNode::addChild(pTVar8,pTVar7);
    uVar12 = std::__cxx11::string::~string((string *)&fmtName);
  }
  return (int)uVar12;
}

Assistant:

void TextureSpecificationTests::init (void)
{
	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} colorFormats[] =
	{
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba32ui",			GL_RGBA32UI,		},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "srgb8_alpha8",		GL_SRGB8_ALPHA8,	},
		{ "rgb10_a2",			GL_RGB10_A2,		},
		{ "rgb10_a2ui",			GL_RGB10_A2UI,		},
		{ "rgba4",				GL_RGBA4,			},
		{ "rgb5_a1",			GL_RGB5_A1,			},
		{ "rgba8_snorm",		GL_RGBA8_SNORM,		},
		{ "rgb8",				GL_RGB8,			},
		{ "rgb565",				GL_RGB565,			},
		{ "r11f_g11f_b10f",		GL_R11F_G11F_B10F,	},
		{ "rgb32f",				GL_RGB32F,			},
		{ "rgb32i",				GL_RGB32I,			},
		{ "rgb32ui",			GL_RGB32UI,			},
		{ "rgb16f",				GL_RGB16F,			},
		{ "rgb16i",				GL_RGB16I,			},
		{ "rgb16ui",			GL_RGB16UI,			},
		{ "rgb8_snorm",			GL_RGB8_SNORM,		},
		{ "rgb8i",				GL_RGB8I,			},
		{ "rgb8ui",				GL_RGB8UI,			},
		{ "srgb8",				GL_SRGB8,			},
		{ "rgb9_e5",			GL_RGB9_E5,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rg16f",				GL_RG16F,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg8i",				GL_RG8I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg8_snorm",			GL_RG8_SNORM,		},
		{ "r32f",				GL_R32F,			},
		{ "r32i",				GL_R32I,			},
		{ "r32ui",				GL_R32UI,			},
		{ "r16f",				GL_R16F,			},
		{ "r16i",				GL_R16I,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r8",					GL_R8,				},
		{ "r8i",				GL_R8I,				},
		{ "r8ui",				GL_R8UI,			},
		{ "r8_snorm",			GL_R8_SNORM,		}
	};

	static const struct
	{
		const char*	name;
		deUint32	internalFormat;
	} depthStencilFormats[] =
	{
		// Depth and stencil formats
		{ "depth_component32f",	GL_DEPTH_COMPONENT32F	},
		{ "depth_component24",	GL_DEPTH_COMPONENT24	},
		{ "depth_component16",	GL_DEPTH_COMPONENT16	},
		{ "depth32f_stencil8",	GL_DEPTH32F_STENCIL8	},
		{ "depth24_stencil8",	GL_DEPTH24_STENCIL8		}
	};

	// Basic TexImage3D usage.
	{
		tcu::TestCaseGroup* basicTexImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_teximage3d", "Basic glTexImage3D() usage");
		addChild(basicTexImageGroup);
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(colorFormats); formatNdx++)
		{
			const char*	fmtName				= colorFormats[formatNdx].name;
			deUint32	format				= colorFormats[formatNdx].internalFormat;
			const int	texCubeArraySize	= 64;
			const int	texCubeArrayLayers	= 6;

			basicTexImageGroup->addChild(new BasicTexImageCubeArrayCase	(m_context,	(string(fmtName) + "_cube_array").c_str(),	"",	format, texCubeArraySize, texCubeArrayLayers));
		}
	}

	// glTexImage3D() pbo cases.
	{
		tcu::TestCaseGroup* pboGroup = new tcu::TestCaseGroup(m_testCtx, "teximage3d_pbo", "glTexImage3D() from PBO");
		addChild(pboGroup);

		// Parameter cases
		static const struct
		{
			const char*	name;
			deUint32	format;
			int			size;
			int			depth;
			int			imageHeight;
			int			rowLength;
			int			skipImages;
			int			skipRows;
			int			skipPixels;
			int			alignment;
			int			offset;
		} parameterCases[] =
		{
			{ "rgb8_offset",		GL_RGB8,	23,	6,	0,	0,	0,	0,	0,	1,	67 },
			{ "rgb8_alignment",		GL_RGB8,	23,	6,	0,	0,	0,	0,	0,	2,	0 },
			{ "rgb8_image_height",	GL_RGB8,	23,	6,	26,	0,	0,	0,	0,	4,	0 },
			{ "rgb8_row_length",	GL_RGB8,	23,	6,	0,	27,	0,	0,	0,	4,	0 },
			{ "rgb8_skip_images",	GL_RGB8,	23,	6,	0,	0,	3,	0,	0,	4,	0 },
			{ "rgb8_skip_rows",		GL_RGB8,	23,	6,	26,	0,	0,	3,	0,	4,	0 },
			{ "rgb8_skip_pixels",	GL_RGB8,	23,	6,	0,	25,	0,	0,	2,	4,	0 }
		};

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(colorFormats); formatNdx++)
		{
			const string	fmtName				= colorFormats[formatNdx].name;
			const deUint32	format				= colorFormats[formatNdx].internalFormat;
			const int		texCubeArraySize	= 20;
			const int		texCubeDepth		= 6;

			pboGroup->addChild(new TexImageCubeArrayBufferCase	(m_context, (fmtName + "_cube_array").c_str(),	"", format, texCubeArraySize, texCubeDepth, 0, 0, 0, 0, 0, 4, 0));
		}

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(parameterCases); ndx++)
		{
			pboGroup->addChild(new TexImageCubeArrayBufferCase(m_context, (string(parameterCases[ndx].name) + "_cube_array").c_str(), "",
														parameterCases[ndx].format,
														parameterCases[ndx].size,
														parameterCases[ndx].depth,
														parameterCases[ndx].imageHeight,
														parameterCases[ndx].rowLength,
														parameterCases[ndx].skipImages,
														parameterCases[ndx].skipRows,
														parameterCases[ndx].skipPixels,
														parameterCases[ndx].alignment,
														parameterCases[ndx].offset));
		}
	}

	// glTexImage3D() depth cases.
	{
		tcu::TestCaseGroup* shadow3dGroup = new tcu::TestCaseGroup(m_testCtx, "teximage3d_depth", "glTexImage3D() with depth or depth/stencil format");
		addChild(shadow3dGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthStencilFormats); ndx++)
		{
			const int	texCubeArraySize	= 64;
			const int	texCubeArrayDepth	= 6;

			shadow3dGroup->addChild(new TexImageCubeArrayDepthCase(m_context, (std::string(depthStencilFormats[ndx].name) + "_cube_array").c_str(), "", depthStencilFormats[ndx].internalFormat, texCubeArraySize, texCubeArrayDepth));
		}
	}

	// glTexImage3D() depth cases with pbo.
	{
		tcu::TestCaseGroup* shadow3dGroup = new tcu::TestCaseGroup(m_testCtx, "teximage3d_depth_pbo", "glTexImage3D() with depth or depth/stencil format with pbo");
		addChild(shadow3dGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthStencilFormats); ndx++)
		{
			const int	texCubeArraySize	= 64;
			const int	texCubeArrayDepth	= 6;

			shadow3dGroup->addChild(new TexImageCubeArrayDepthBufferCase(m_context, (std::string(depthStencilFormats[ndx].name) + "_cube_array").c_str(), "", depthStencilFormats[ndx].internalFormat, texCubeArraySize, texCubeArrayDepth));
		}
	}

	// glTexSubImage3D() PBO cases.
	{
		tcu::TestCaseGroup* pboGroup = new tcu::TestCaseGroup(m_testCtx, "texsubimage3d_pbo", "glTexSubImage3D() pixel buffer object tests");
		addChild(pboGroup);

		static const struct
		{
			const char*	name;
			deUint32	format;
			int			size;
			int			depth;
			int			subX;
			int			subY;
			int			subZ;
			int			subW;
			int			subH;
			int			subD;
			int			imageHeight;
			int			rowLength;
			int			skipImages;
			int			skipRows;
			int			skipPixels;
			int			alignment;
			int			offset;
		} paramCases[] =
		{
			{ "rgb8_offset",		GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	0,	0,	0,	0,	0,	4,	67 },
			{ "rgb8_image_height",	GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	26,	0,	0,	0,	0,	4,	0 },
			{ "rgb8_row_length",	GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	0,	27,	0,	0,	0,	4,	0 },
			{ "rgb8_skip_images",	GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	0,	0,	3,	0,	0,	4,	0 },
			{ "rgb8_skip_rows",		GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	22,	0,	0,	3,	0,	4,	0 },
			{ "rgb8_skip_pixels",	GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	0,	25,	0,	0,	2,	4,	0 }
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorFormats); ndx++)
		{
			pboGroup->addChild(new TexSubImageCubeArrayBufferCase(m_context, (std::string(colorFormats[ndx].name) + "_cube_array").c_str(), "",
														   colorFormats[ndx].internalFormat,
														   26,	// Size
														   12,	// Depth
														   1,	// Sub X
														   2,	// Sub Y
														   0,	// Sub Z
														   23,	// Sub W
														   19,	// Sub H
														   8,	// Sub D
														   0,	// Image height
														   0,	// Row length
														   0,	// Skip images
														   0,	// Skip rows
														   0,	// Skip pixels
														   4,	// Alignment
														   0	/* offset */));
		}

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(paramCases); ndx++)
		{
			pboGroup->addChild(new TexSubImageCubeArrayBufferCase(m_context, (std::string(paramCases[ndx].name) + "_cube_array").c_str(), "",
														   paramCases[ndx].format,
														   paramCases[ndx].size,
														   paramCases[ndx].depth,
														   paramCases[ndx].subX,
														   paramCases[ndx].subY,
														   paramCases[ndx].subZ,
														   paramCases[ndx].subW,
														   paramCases[ndx].subH,
														   paramCases[ndx].subD,
														   paramCases[ndx].imageHeight,
														   paramCases[ndx].rowLength,
														   paramCases[ndx].skipImages,
														   paramCases[ndx].skipRows,
														   paramCases[ndx].skipPixels,
														   paramCases[ndx].alignment,
														   paramCases[ndx].offset));
		}
	}

	// glTexSubImage3D() depth cases.
	{
		tcu::TestCaseGroup* shadow3dGroup = new tcu::TestCaseGroup(m_testCtx, "texsubimage3d_depth", "glTexSubImage3D() with depth or depth/stencil format");
		addChild(shadow3dGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthStencilFormats); ndx++)
		{
			const int	texCubeArraySize	= 57;
			const int	texCubeArrayLayers	= 6;

			shadow3dGroup->addChild(new TexSubImageCubeArrayDepthCase(m_context, (std::string(depthStencilFormats[ndx].name) + "_cube_array").c_str(), "", depthStencilFormats[ndx].internalFormat, texCubeArraySize, texCubeArrayLayers));
		}
	}

	// glTexStorage3D() cases.
	{
		tcu::TestCaseGroup* texStorageGroup = new tcu::TestCaseGroup(m_testCtx, "texstorage3d", "Basic glTexStorage3D() usage");
		addChild(texStorageGroup);

		// All formats.
		tcu::TestCaseGroup* formatGroup = new tcu::TestCaseGroup(m_testCtx, "format", "glTexStorage3D() with all formats");
		texStorageGroup->addChild(formatGroup);

		// Color formats.
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(colorFormats); formatNdx++)
		{
			const char*	fmtName				= colorFormats[formatNdx].name;
			deUint32	internalFormat		= colorFormats[formatNdx].internalFormat;
			const int	texCubeArraySize	= 57;
			const int	texCubeArrayLayers	= 6;
			int			texCubeArrayLevels	= maxLevelCount(texCubeArraySize);

			formatGroup->addChild(new BasicTexStorageCubeArrayCase	(m_context, (string(fmtName) + "_cube_array").c_str(),	"", internalFormat, texCubeArraySize, texCubeArrayLayers, texCubeArrayLevels));
		}

		// Depth/stencil formats (only 2D texture array is supported).
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); formatNdx++)
		{
			const char*	fmtName				= depthStencilFormats[formatNdx].name;
			deUint32	internalFormat		= depthStencilFormats[formatNdx].internalFormat;
			const int	texCubeArraySize	= 57;
			const int	texCubeArrayLayers	= 6;
			int			texCubeArrayLevels	= maxLevelCount(texCubeArraySize);

			formatGroup->addChild(new BasicTexStorageCubeArrayCase	(m_context, (string(fmtName) + "_cube_array").c_str(),	"", internalFormat, texCubeArraySize, texCubeArrayLayers, texCubeArrayLevels));
		}

		// Sizes.
		static const struct
		{
			int				size;
			int				layers;
			int				levels;
		} texCubeArraySizes[] =
		{
			//	Sz	La	Le
			{	1,	6,	1 },
			{	2,	6,	2 },
			{	32,	6,	3 },
			{	64,	6,	4 },
			{	57,	12,	1 },
			{	57,	12,	2 },
			{	57,	12,	6 }
		};

		tcu::TestCaseGroup* sizeGroup = new tcu::TestCaseGroup(m_testCtx, "size", "glTexStorage3D() with various sizes");
		texStorageGroup->addChild(sizeGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(texCubeArraySizes); ndx++)
		{
			const deUint32		format		= GL_RGBA8;
			int					size		= texCubeArraySizes[ndx].size;
			int					layers		= texCubeArraySizes[ndx].layers;
			int					levels		= texCubeArraySizes[ndx].levels;
			string				name		= string("cube_array_") + de::toString(size) + "x" + de::toString(size) + "x" + de::toString(layers) + "_" + de::toString(levels) + "_levels";

			sizeGroup->addChild(new BasicTexStorageCubeArrayCase(m_context, name.c_str(), "", format, size, layers, levels));
		}
	}
}